

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_write_state.cpp
# Opt level: O1

void __thiscall duckdb::WALWriteState::WriteDelete(WALWriteState *this,DeleteInfo *info)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  data_ptr_t pdVar1;
  WriteAheadLog *this_01;
  shared_ptr<duckdb::DataTableInfo,_true> *psVar2;
  DataChunk *this_02;
  pointer pDVar3;
  Allocator *allocator;
  reference pvVar4;
  ulong uVar5;
  uint16_t *puVar6;
  type chunk;
  UndoFlags new_op;
  initializer_list<duckdb::LogicalType> __l;
  vector<duckdb::LogicalType,_true> delete_types;
  allocator_type local_51;
  LogicalType local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  psVar2 = DataTable::GetDataTableInfo(info->table);
  SwitchTable(this,(psVar2->internal).
                   super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              new_op);
  this_00 = &this->delete_chunk;
  if ((this->delete_chunk).
      super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl == (DataChunk *)0x0) {
    this_02 = (DataChunk *)operator_new(0x40);
    DataChunk::DataChunk(this_02);
    ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
              ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
               this_00,this_02);
    LogicalType::LogicalType(&local_50,BIGINT);
    __l._M_len = 1;
    __l._M_array = &local_50;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_38,__l,&local_51);
    LogicalType::~LogicalType(&local_50);
    pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (this_00);
    allocator = Allocator::DefaultAllocator();
    DataChunk::Initialize(pDVar3,allocator,(vector<duckdb::LogicalType,_true> *)&local_38,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  }
  pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&pDVar3->data,0);
  pdVar1 = pvVar4->data;
  if (info->is_consecutive == true) {
    if (info->count != 0) {
      uVar5 = 0;
      do {
        *(idx_t *)(pdVar1 + uVar5 * 8) = info->base_row + uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar5 < info->count);
    }
  }
  else {
    puVar6 = DeleteInfo::GetRows(info);
    if (info->count != 0) {
      uVar5 = 0;
      do {
        *(ulong *)(pdVar1 + uVar5 * 8) = (ulong)puVar6[uVar5] + info->base_row;
        uVar5 = uVar5 + 1;
      } while (uVar5 < info->count);
    }
  }
  pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pDVar3->count = info->count;
  this_01 = this->log;
  chunk = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                    (this_00);
  WriteAheadLog::WriteDelete(this_01,chunk);
  return;
}

Assistant:

void WALWriteState::WriteDelete(DeleteInfo &info) {
	// switch to the current table, if necessary
	SwitchTable(info.table->GetDataTableInfo().get(), UndoFlags::DELETE_TUPLE);

	if (!delete_chunk) {
		delete_chunk = make_uniq<DataChunk>();
		vector<LogicalType> delete_types = {LogicalType::ROW_TYPE};
		delete_chunk->Initialize(Allocator::DefaultAllocator(), delete_types);
	}
	auto rows = FlatVector::GetData<row_t>(delete_chunk->data[0]);
	if (info.is_consecutive) {
		for (idx_t i = 0; i < info.count; i++) {
			rows[i] = UnsafeNumericCast<int64_t>(info.base_row + i);
		}
	} else {
		auto delete_rows = info.GetRows();
		for (idx_t i = 0; i < info.count; i++) {
			rows[i] = UnsafeNumericCast<int64_t>(info.base_row) + delete_rows[i];
		}
	}
	delete_chunk->SetCardinality(info.count);
	log.WriteDelete(*delete_chunk);
}